

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O1

bool __thiscall Debugger::GetStacks(Debugger *this,vector<Stack,_std::allocator<Stack>_> *stacks)

{
  pointer *ppIVar1;
  pointer pSVar2;
  Arena<Variable> *pAVar3;
  iterator iVar4;
  vector<Stack,_std::allocator<Stack>_> *pvVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  Variable *pVVar11;
  lua_State *L;
  uint uVar12;
  int iVar13;
  int i;
  int iVar14;
  char *pcVar15;
  Idx<Variable> id;
  Idx<Variable> id_00;
  Idx<Variable> variable;
  Idx<Variable> variable_00;
  Idx<Variable> var;
  lua_Debug ar;
  string local_4b8;
  lua_State *local_498;
  vector<Stack,_std::allocator<Stack>_> *local_490;
  vector<Idx<Variable>,std::allocator<Idx<Variable>>> *local_488;
  lua_Debug local_480;
  
  L = this->currentL;
  if (L != (lua_State *)0x0) {
    iVar8 = 0;
    local_498 = L;
    local_490 = stacks;
    do {
      iVar13 = 0;
      do {
        memset(&local_480,0,0x450);
        iVar6 = (*lua_getstack)(L,iVar13,&local_480);
        if ((iVar6 != 0) &&
           (iVar7 = (*lua_getinfo)(L,"nSlu",&local_480), pvVar5 = local_490, iVar7 != 0)) {
          std::vector<Stack,_std::allocator<Stack>_>::emplace_back<>(local_490);
          pSVar2 = (pvVar5->super__Vector_base<Stack,_std::allocator<Stack>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          GetFile_abi_cxx11_(&local_4b8,this,&local_480);
          std::__cxx11::string::operator=((string *)&pSVar2[-1].file,(string *)&local_4b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_4b8._M_dataplus._M_p._4_4_,(uint)local_4b8._M_dataplus._M_p) !=
              &local_4b8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_4b8._M_dataplus._M_p._4_4_,
                                     (uint)local_4b8._M_dataplus._M_p));
          }
          pcVar9 = getDebugName(&local_480);
          pcVar15 = "";
          if (pcVar9 != (char *)0x0) {
            pcVar15 = getDebugName(&local_480);
          }
          pcVar9 = (char *)pSVar2[-1].functionName._M_string_length;
          strlen(pcVar15);
          std::__cxx11::string::_M_replace((ulong)&pSVar2[-1].functionName,0,pcVar9,(ulong)pcVar15);
          pSVar2[-1].level = iVar8;
          iVar7 = getDebugCurrentLine(&local_480);
          pSVar2[-1].line = iVar7;
          iVar7 = 1;
          while( true ) {
            pcVar9 = (*lua_getlocal)(L,&local_480,iVar7);
            if (pcVar9 == (char *)0x0) {
              lVar10 = 6;
            }
            else if (*pcVar9 == '(') {
              (*lua_settop)(L,-2);
              lVar10 = 0;
            }
            else {
              pAVar3 = pSVar2[-1].variableArena.
                       super___shared_ptr<Arena<Variable>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              uVar12 = (int)((ulong)((long)(pAVar3->_data).
                                           super__Vector_base<Variable,_std::allocator<Variable>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                    (long)(pAVar3->_data).
                                          super__Vector_base<Variable,_std::allocator<Variable>_>.
                                          _M_impl.super__Vector_impl_data._M_start) >> 3) *
                       0x286bca1b;
              std::vector<Variable,_std::allocator<Variable>_>::emplace_back<>(&pAVar3->_data);
              id._4_4_ = 0;
              id.Raw = uVar12;
              id._arena = pAVar3;
              local_4b8._M_dataplus._M_p._0_4_ = uVar12;
              local_4b8._M_string_length = (size_type)pAVar3;
              pVVar11 = Arena<Variable>::Index(pAVar3,id);
              pcVar15 = (char *)(pVVar11->name)._M_string_length;
              strlen(pcVar9);
              std::__cxx11::string::_M_replace((ulong)&pVVar11->name,0,pcVar15,(ulong)pcVar9);
              this->arenaRef =
                   pSVar2[-1].variableArena.
                   super___shared_ptr<Arena<Variable>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
              variable._4_4_ = 0;
              variable.Raw = (uint)local_4b8._M_dataplus._M_p;
              variable._arena = (ArenaClass *)local_4b8._M_string_length;
              GetVariable(this,L,variable,-1,1,true);
              this->arenaRef = (Arena<Variable> *)0x0;
              (*lua_settop)(L,-2);
              iVar4._M_current =
                   pSVar2[-1].localVariables.
                   super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar4._M_current ==
                  pSVar2[-1].localVariables.
                  super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<Idx<Variable>,std::allocator<Idx<Variable>>>::
                _M_realloc_insert<Idx<Variable>const&>
                          ((vector<Idx<Variable>,std::allocator<Idx<Variable>>> *)
                           &pSVar2[-1].localVariables,iVar4,(Idx<Variable> *)&local_4b8);
              }
              else {
                *(ulong *)iVar4._M_current =
                     CONCAT44(local_4b8._M_dataplus._M_p._4_4_,(uint)local_4b8._M_dataplus._M_p);
                (iVar4._M_current)->_arena = (ArenaClass *)local_4b8._M_string_length;
                ppIVar1 = &pSVar2[-1].localVariables.
                           super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
                *ppIVar1 = *ppIVar1 + 1;
              }
              lVar10 = 0;
            }
            if (lVar10 != 0) break;
            iVar7 = iVar7 + 1;
          }
          iVar7 = (*lua_getinfo)(L,"f",&local_480);
          if (iVar7 != 0) {
            iVar7 = (*lua_gettop)(L);
            pcVar9 = (*lua_getupvalue)(L,iVar7,1);
            if (pcVar9 != (char *)0x0) {
              local_488 = (vector<Idx<Variable>,std::allocator<Idx<Variable>>> *)
                          &pSVar2[-1].upvalueVariables;
              iVar14 = 2;
              do {
                pAVar3 = pSVar2[-1].variableArena.
                         super___shared_ptr<Arena<Variable>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                uVar12 = (int)((ulong)((long)(pAVar3->_data).
                                             super__Vector_base<Variable,_std::allocator<Variable>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pAVar3->_data).
                                            super__Vector_base<Variable,_std::allocator<Variable>_>.
                                            _M_impl.super__Vector_impl_data._M_start) >> 3) *
                         0x286bca1b;
                std::vector<Variable,_std::allocator<Variable>_>::emplace_back<>(&pAVar3->_data);
                id_00._4_4_ = 0;
                id_00.Raw = uVar12;
                id_00._arena = pAVar3;
                local_4b8._M_dataplus._M_p._0_4_ = uVar12;
                local_4b8._M_string_length = (size_type)pAVar3;
                pVVar11 = Arena<Variable>::Index(pAVar3,id_00);
                pcVar15 = (char *)(pVVar11->name)._M_string_length;
                strlen(pcVar9);
                std::__cxx11::string::_M_replace((ulong)&pVVar11->name,0,pcVar15,(ulong)pcVar9);
                this->arenaRef =
                     pSVar2[-1].variableArena.
                     super___shared_ptr<Arena<Variable>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                variable_00._4_4_ = 0;
                variable_00.Raw = (uint)local_4b8._M_dataplus._M_p;
                variable_00._arena = (ArenaClass *)local_4b8._M_string_length;
                GetVariable(this,L,variable_00,-1,1,true);
                this->arenaRef = (Arena<Variable> *)0x0;
                (*lua_settop)(L,-2);
                iVar4._M_current =
                     pSVar2[-1].upvalueVariables.
                     super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar4._M_current ==
                    pSVar2[-1].upvalueVariables.
                    super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<Idx<Variable>,std::allocator<Idx<Variable>>>::
                  _M_realloc_insert<Idx<Variable>const&>
                            (local_488,iVar4,(Idx<Variable> *)&local_4b8);
                }
                else {
                  *(ulong *)iVar4._M_current =
                       CONCAT44(local_4b8._M_dataplus._M_p._4_4_,(uint)local_4b8._M_dataplus._M_p);
                  (iVar4._M_current)->_arena = (ArenaClass *)local_4b8._M_string_length;
                  ppIVar1 = &pSVar2[-1].upvalueVariables.
                             super__Vector_base<Idx<Variable>,_std::allocator<Idx<Variable>_>_>.
                             _M_impl.super__Vector_impl_data._M_finish;
                  *ppIVar1 = *ppIVar1 + 1;
                }
                pcVar9 = (*lua_getupvalue)(L,iVar7,iVar14);
                iVar14 = iVar14 + 1;
              } while (pcVar9 != (char *)0x0);
            }
            (*lua_settop)(L,-2);
          }
          iVar8 = iVar8 + 1;
          iVar13 = iVar13 + 1;
        }
      } while (iVar6 != 0);
      L = ExtensionPoint::QueryParentThread(&this->manager->extension,L);
    } while (L != (lua_State *)0x0);
    this->currentL = local_498;
  }
  return false;
}

Assistant:

bool Debugger::GetStacks(std::vector<Stack> &stacks) {
	if (!currentL) {
		return false;
	}

	auto prevCurrentL = currentL;
	auto L = currentL;

	int totalLevel = 0;
	while (true) {
		int level = 0;
		while (true) {
			lua_Debug ar{};
			if (!lua_getstack(L, level, &ar)) {
				break;
			}
			if (!lua_getinfo(L, "nSlu", &ar)) {
				continue;
			}
			// C++ 17 only return T&
			stacks.emplace_back();
			auto &stack = stacks.back();
			stack.file = GetFile(&ar);
			stack.functionName = getDebugName(&ar) == nullptr ? "" : getDebugName(&ar);
			stack.level = totalLevel++;
			stack.line = getDebugCurrentLine(&ar);

			// get variables
			{
				for (int i = 1;; i++) {
					const char *name = lua_getlocal(L, &ar, i);
					if (name == nullptr) {
						break;
					}
					if (name[0] == '(') {
						lua_pop(L, 1);
						continue;
					}

					// add local variable
					auto var = stack.variableArena->Alloc();
					var->name = name;
					SetVariableArena(stack.variableArena.get());
					GetVariable(L, var, -1, 1);
					ClearVariableArenaRef();
					lua_pop(L, 1);
					stack.localVariables.push_back(var);
				}

				if (lua_getinfo(L, "f", &ar)) {
					const int fIdx = lua_gettop(L);
					for (int i = 1;; i++) {
						const char *name = lua_getupvalue(L, fIdx, i);
						if (!name) {
							break;
						}

						// add up variable
						auto var = stack.variableArena->Alloc();
						var->name = name;
						SetVariableArena(stack.variableArena.get());
						GetVariable(L, var, -1, 1);
						ClearVariableArenaRef();
						lua_pop(L, 1);
						stack.upvalueVariables.push_back(var);
					}
					// pop function
					lua_pop(L, 1);
				}
			}

			level++;
		}

		// TODO
		lua_State *PL = manager->extension.QueryParentThread(L);

		if (PL != nullptr) {
			L = PL;
		} else {
			break;
		}
	}

	SetCurrentState(prevCurrentL);

	return false;
}